

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwhatsthis.cpp
# Opt level: O1

void __thiscall QWhatsThat::mouseReleaseEvent(QWhatsThat *this,QMouseEvent *e)

{
  Data *pDVar1;
  QWidgetData *pQVar2;
  undefined1 *puVar3;
  QArrayData *pQVar4;
  bool bVar5;
  char cVar6;
  undefined4 uVar7;
  uint uVar8;
  ulong uVar9;
  ulong uVar10;
  QPointF *pQVar11;
  QObject *pQVar12;
  long in_FS_OFFSET;
  double extraout_XMM0_Qa;
  undefined1 auVar13 [16];
  double extraout_XMM1_Qa;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  QStringView QVar16;
  QStringView QVar17;
  QWhatsThisClickedEvent e_1;
  QPointF local_a8;
  undefined1 *local_98;
  undefined1 *puStack_90;
  undefined1 *local_88;
  QString local_78;
  QPointF local_58;
  undefined1 *local_48;
  long local_38;
  
  pQVar11 = &local_a8;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (this->pressed != true) goto LAB_003a6f34;
  pDVar1 = (this->widget).wp.d;
  if ((((pDVar1 != (Data *)0x0) && (*(int *)(pDVar1 + 4) != 0)) &&
      ((this->widget).wp.value != (QObject *)0x0)) &&
     ((*(int *)(e + 0x40) == 1 && (this->doc != (QTextDocument *)0x0)))) {
    pQVar2 = (this->super_QWidget).data;
    local_a8.yp = (qreal)CONCAT44((pQVar2->crect).y2.m_i - (pQVar2->crect).y1.m_i,
                                  (pQVar2->crect).x2.m_i - (pQVar2->crect).x1.m_i);
    local_a8.xp = 0.0;
    uVar7 = QEventPoint::position();
    auVar14._0_8_ =
         (double)((ulong)extraout_XMM1_Qa & 0x8000000000000000 | 0x3fe0000000000000) +
         extraout_XMM1_Qa;
    auVar14._8_8_ =
         (double)((ulong)extraout_XMM0_Qa & 0x8000000000000000 | 0x3fe0000000000000) +
         extraout_XMM0_Qa;
    auVar14 = minpd(_DAT_0066f5d0,auVar14);
    auVar13._8_8_ = -(ulong)(-2147483648.0 < auVar14._8_8_);
    auVar13._0_8_ = -(ulong)(-2147483648.0 < auVar14._0_8_);
    uVar8 = movmskpd(uVar7,auVar13);
    uVar10 = 0x8000000000000000;
    if ((uVar8 & 1) != 0) {
      uVar10 = (ulong)(uint)(int)auVar14._0_8_ << 0x20;
    }
    uVar9 = 0x80000000;
    if ((uVar8 & 2) != 0) {
      uVar9 = (ulong)(uint)(int)auVar14._8_8_;
    }
    local_58.xp = (qreal)(uVar9 | uVar10);
    e = (QMouseEvent *)&local_58;
    cVar6 = QRect::contains((QPoint *)&local_a8,SUB81(e,0));
    if (cVar6 != '\0') {
      local_48 = &DAT_aaaaaaaaaaaaaaaa;
      local_58.xp = (qreal)&DAT_aaaaaaaaaaaaaaaa;
      local_58.yp = (qreal)&DAT_aaaaaaaaaaaaaaaa;
      e = (QMouseEvent *)QTextDocument::documentLayout();
      auVar14 = QEventPoint::position();
      auVar15._0_8_ =
           (double)((ulong)auVar14._0_8_ & 0x8000000000000000 | 0x3fe0000000000000) + auVar14._0_8_;
      auVar15._8_8_ =
           (double)((ulong)auVar14._8_8_ & 0x8000000000000000 | 0x3fe0000000000000) + auVar14._8_8_;
      auVar14 = minpd(_DAT_0066f5d0,auVar15);
      auVar14 = maxpd(auVar14,_DAT_0066f5e0);
      local_a8.xp = (qreal)((int)auVar14._0_8_ + -0xc);
      local_a8.yp = (qreal)((int)auVar14._8_8_ + -8);
      QAbstractTextDocumentLayout::anchorAt(&local_58);
      local_78.d.d = (Data *)0x0;
      local_78.d.ptr = (char16_t *)0x0;
      local_78.d.size = 0;
      puVar3 = (undefined1 *)(this->anchor).d.size;
      if (puVar3 == local_48) {
        e = (QMouseEvent *)(this->anchor).d.ptr;
        QVar16.m_data = (storage_type_conflict *)e;
        QVar16.m_size = (qsizetype)puVar3;
        QVar17.m_data = (storage_type_conflict *)local_58.yp;
        QVar17.m_size = (qsizetype)local_48;
        cVar6 = QtPrivate::equalStrings(QVar16,QVar17);
        if (cVar6 != '\0') {
          e = (QMouseEvent *)&local_58;
          QString::operator=(&local_78,(QString *)e);
        }
      }
      if ((this->anchor).d.ptr != (char16_t *)0x0) {
        pQVar4 = &((this->anchor).d.d)->super_QArrayData;
        (this->anchor).d.d = (Data *)0x0;
        (this->anchor).d.ptr = (char16_t *)0x0;
        (this->anchor).d.size = 0;
        if (pQVar4 != (QArrayData *)0x0) {
          LOCK();
          (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i =
               (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((pQVar4->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
            e = (QMouseEvent *)0x2;
            QArrayData::deallocate(pQVar4,2,0x10);
          }
        }
      }
      if (local_78.d.size == 0) {
LAB_003a6ede:
        bVar5 = true;
      }
      else {
        local_88 = &DAT_aaaaaaaaaaaaaaaa;
        local_98 = &DAT_aaaaaaaaaaaaaaaa;
        puStack_90 = &DAT_aaaaaaaaaaaaaaaa;
        local_a8.xp = (qreal)&DAT_aaaaaaaaaaaaaaaa;
        local_a8.yp = (qreal)&DAT_aaaaaaaaaaaaaaaa;
        QWhatsThisClickedEvent::QWhatsThisClickedEvent
                  ((QWhatsThisClickedEvent *)&local_a8,(QString *)&local_78);
        pDVar1 = (this->widget).wp.d;
        if ((pDVar1 == (Data *)0x0) || (*(int *)(pDVar1 + 4) == 0)) {
          pQVar12 = (QObject *)0x0;
        }
        else {
          pQVar12 = (this->widget).wp.value;
        }
        cVar6 = QCoreApplication::sendEvent(pQVar12,(QEvent *)&local_a8);
        QWhatsThisClickedEvent::~QWhatsThisClickedEvent((QWhatsThisClickedEvent *)&local_a8);
        e = (QMouseEvent *)pQVar11;
        if (cVar6 == '\0') goto LAB_003a6ede;
        bVar5 = false;
      }
      if (&(local_78.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          e = (QMouseEvent *)0x2;
          QArrayData::deallocate(&(local_78.d.d)->super_QArrayData,2,0x10);
        }
      }
      if ((QArrayData *)local_58.xp != (QArrayData *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)local_58.xp)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)local_58.xp)->_q_value).super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((QBasicAtomicInt *)local_58.xp)->_q_value).super___atomic_base<int>._M_i == 0) {
          e = (QMouseEvent *)0x2;
          QArrayData::deallocate((QArrayData *)local_58.xp,2,0x10);
        }
      }
      if (!bVar5) goto LAB_003a6f34;
    }
  }
  QWidget::close(&this->super_QWidget,(int)e);
LAB_003a6f34:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QWhatsThat::mouseReleaseEvent(QMouseEvent* e)
{
    if (!pressed)
        return;
    if (widget && e->button() == Qt::LeftButton && doc && rect().contains(e->position().toPoint())) {
        QString a = doc->documentLayout()->anchorAt(e->position().toPoint() -  QPoint(hMargin, vMargin));
        QString href;
        if (anchor == a)
            href = a;
        anchor.clear();
        if (!href.isEmpty()) {
            QWhatsThisClickedEvent e(href);
            if (QCoreApplication::sendEvent(widget, &e))
                return;
        }
    }
    close();
}